

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O2

void __thiscall
embree::sse2::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::SubdivRecalculatePrimRef,_2UL>::
TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,SubdivRecalculatePrimRef *recalculatePrimRef)

{
  PrimRefMB *pPVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  size_t sVar13;
  float fVar14;
  float fVar15;
  float fVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  anon_class_16_2_3fe48c61 local_c8;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  fVar14 = time_range.lower;
  fVar19 = time_range.upper;
  fVar33 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar26 = (set->super_PrimInfoMB).max_time_range.upper - fVar33;
  fVar20 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fVar15 = roundf((((fVar14 * 0.5 + fVar19 * 0.5) - fVar33) / fVar26) * fVar20);
  fVar33 = (fVar15 / fVar20) * fVar26 + fVar33;
  if ((fVar14 < fVar33) && (fVar33 < fVar19)) {
    for (; begin < end; begin = begin + 1) {
      pPVar1 = prims + begin;
      fVar15 = prims[begin].time_range.upper;
      fVar20 = fVar15 * 0.9999;
      if ((fVar14 < fVar20) && (fVar26 = (pPVar1->time_range).lower, fVar26 * 1.0001 < fVar33)) {
        fVar21 = (float)(uint)(pPVar1->lbounds).bounds1.upper.field_0.m128[3];
        fVar30 = (fVar14 - fVar26) / (fVar15 - fVar26);
        fVar26 = (fVar33 - fVar26) / (fVar15 - fVar26);
        fVar34 = fVar26 * fVar21;
        local_c8.this = recalculatePrimRef;
        local_c8.prim = pPVar1;
        fVar15 = floorf(fVar30 * fVar21);
        fVar20 = ceilf(fVar34);
        iVar12 = (int)fVar15;
        if (fVar15 <= 0.0) {
          fVar15 = 0.0;
        }
        fVar22 = fVar20;
        if (fVar21 <= fVar20) {
          fVar22 = fVar21;
        }
        iVar11 = -1;
        if (-1 < iVar12) {
          iVar11 = iVar12;
        }
        iVar10 = (int)fVar21 + 1;
        if ((int)fVar20 < (int)fVar21 + 1) {
          iVar10 = (int)fVar20;
        }
        SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                  (&blower0,&local_c8,(long)(int)fVar15);
        SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                  (&bupper1,&local_c8,(long)(int)fVar22);
        fVar20 = fVar30 * fVar21 - fVar15;
        if (iVar10 - iVar11 == 1) {
          if (fVar20 <= 0.0) {
            fVar20 = 0.0;
          }
          fVar15 = 1.0 - fVar20;
          fVar38 = fVar15 * blower0.lower.field_0.m128[0] + fVar20 * bupper1.lower.field_0.m128[0];
          fVar39 = fVar15 * blower0.lower.field_0.m128[1] + fVar20 * bupper1.lower.field_0.m128[1];
          fVar40 = fVar15 * blower0.lower.field_0.m128[2] + fVar20 * bupper1.lower.field_0.m128[2];
          fVar41 = fVar15 * blower0.lower.field_0.m128[3] + fVar20 * bupper1.lower.field_0.m128[3];
          fVar35 = fVar15 * blower0.upper.field_0.m128[0] + fVar20 * bupper1.upper.field_0.m128[0];
          fVar36 = fVar15 * blower0.upper.field_0.m128[1] + fVar20 * bupper1.upper.field_0.m128[1];
          fVar37 = fVar15 * blower0.upper.field_0.m128[2] + fVar20 * bupper1.upper.field_0.m128[2];
          fVar20 = fVar15 * blower0.upper.field_0.m128[3] + fVar20 * bupper1.upper.field_0.m128[3];
          fVar22 = fVar22 - fVar34;
          if (fVar22 <= 0.0) {
            fVar22 = 0.0;
          }
          fVar15 = 1.0 - fVar22;
          fVar42 = bupper1.lower.field_0.m128[0] * fVar15 + blower0.lower.field_0.m128[0] * fVar22;
          fVar43 = bupper1.lower.field_0.m128[1] * fVar15 + blower0.lower.field_0.m128[1] * fVar22;
          fVar44 = bupper1.lower.field_0.m128[2] * fVar15 + blower0.lower.field_0.m128[2] * fVar22;
          fVar45 = bupper1.lower.field_0.m128[3] * fVar15 + blower0.lower.field_0.m128[3] * fVar22;
          fVar34 = fVar15 * bupper1.upper.field_0.m128[0] + fVar22 * blower0.upper.field_0.m128[0];
          fVar31 = fVar15 * bupper1.upper.field_0.m128[1] + fVar22 * blower0.upper.field_0.m128[1];
          fVar32 = fVar15 * bupper1.upper.field_0.m128[2] + fVar22 * blower0.upper.field_0.m128[2];
          fVar15 = fVar15 * bupper1.upper.field_0.m128[3] + fVar22 * blower0.upper.field_0.m128[3];
        }
        else {
          SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                    (&blower1,&local_c8,(long)((int)fVar15 + 1));
          SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                    (&bupper0,&local_c8,(long)((int)fVar22 + -1));
          if (fVar20 <= 0.0) {
            fVar20 = 0.0;
          }
          fVar15 = 1.0 - fVar20;
          fVar38 = blower0.lower.field_0.m128[0] * fVar15 + blower1.lower.field_0.m128[0] * fVar20;
          fVar39 = blower0.lower.field_0.m128[1] * fVar15 + blower1.lower.field_0.m128[1] * fVar20;
          fVar40 = blower0.lower.field_0.m128[2] * fVar15 + blower1.lower.field_0.m128[2] * fVar20;
          fVar41 = blower0.lower.field_0.m128[3] * fVar15 + blower1.lower.field_0.m128[3] * fVar20;
          fVar35 = fVar15 * blower0.upper.field_0.m128[0] + fVar20 * blower1.upper.field_0.m128[0];
          fVar36 = fVar15 * blower0.upper.field_0.m128[1] + fVar20 * blower1.upper.field_0.m128[1];
          fVar37 = fVar15 * blower0.upper.field_0.m128[2] + fVar20 * blower1.upper.field_0.m128[2];
          fVar20 = fVar15 * blower0.upper.field_0.m128[3] + fVar20 * blower1.upper.field_0.m128[3];
          fVar15 = fVar22 - fVar34;
          if (fVar22 - fVar34 <= 0.0) {
            fVar15 = 0.0;
          }
          fVar22 = 1.0 - fVar15;
          fVar42 = bupper1.lower.field_0.m128[0] * fVar22 + bupper0.lower.field_0.m128[0] * fVar15;
          fVar43 = bupper1.lower.field_0.m128[1] * fVar22 + bupper0.lower.field_0.m128[1] * fVar15;
          fVar44 = bupper1.lower.field_0.m128[2] * fVar22 + bupper0.lower.field_0.m128[2] * fVar15;
          fVar45 = bupper1.lower.field_0.m128[3] * fVar22 + bupper0.lower.field_0.m128[3] * fVar15;
          fVar34 = fVar22 * bupper1.upper.field_0.m128[0] + fVar15 * bupper0.upper.field_0.m128[0];
          fVar31 = fVar22 * bupper1.upper.field_0.m128[1] + fVar15 * bupper0.upper.field_0.m128[1];
          fVar32 = fVar22 * bupper1.upper.field_0.m128[2] + fVar15 * bupper0.upper.field_0.m128[2];
          fVar15 = fVar22 * bupper1.upper.field_0.m128[3] + fVar15 * bupper0.upper.field_0.m128[3];
          if (iVar12 < 0) {
            iVar12 = -1;
          }
          sVar13 = (size_t)iVar12;
          while (sVar13 = sVar13 + 1, (long)sVar13 < (long)iVar10) {
            fVar22 = ((float)(int)sVar13 / fVar21 - fVar30) / (fVar26 - fVar30);
            fVar27 = 1.0 - fVar22;
            local_a8 = fVar38 * fVar27 + fVar42 * fVar22;
            fStack_a4 = fVar39 * fVar27 + fVar43 * fVar22;
            fStack_a0 = fVar40 * fVar27 + fVar44 * fVar22;
            fStack_9c = fVar41 * fVar27 + fVar45 * fVar22;
            local_b8 = fVar27 * fVar35 + fVar22 * fVar34;
            fStack_b4 = fVar27 * fVar36 + fVar22 * fVar31;
            fStack_b0 = fVar27 * fVar37 + fVar22 * fVar32;
            fStack_ac = fVar27 * fVar20 + fVar22 * fVar15;
            SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                      (&bi,&local_c8,sVar13);
            auVar18._0_4_ = bi.lower.field_0.m128[0] - local_a8;
            auVar18._4_4_ = bi.lower.field_0.m128[1] - fStack_a4;
            auVar18._8_4_ = bi.lower.field_0.m128[2] - fStack_a0;
            auVar18._12_4_ = bi.lower.field_0.m128[3] - fStack_9c;
            auVar25._0_4_ = bi.upper.field_0.m128[0] - local_b8;
            auVar25._4_4_ = bi.upper.field_0.m128[1] - fStack_b4;
            auVar25._8_4_ = bi.upper.field_0.m128[2] - fStack_b0;
            auVar25._12_4_ = bi.upper.field_0.m128[3] - fStack_ac;
            auVar18 = minps(auVar18,ZEXT816(0));
            auVar25 = maxps(auVar25,ZEXT816(0));
            fVar38 = fVar38 + auVar18._0_4_;
            fVar39 = fVar39 + auVar18._4_4_;
            fVar40 = fVar40 + auVar18._8_4_;
            fVar41 = fVar41 + auVar18._12_4_;
            fVar42 = fVar42 + auVar18._0_4_;
            fVar43 = fVar43 + auVar18._4_4_;
            fVar44 = fVar44 + auVar18._8_4_;
            fVar45 = fVar45 + auVar18._12_4_;
            fVar35 = fVar35 + auVar25._0_4_;
            fVar36 = fVar36 + auVar25._4_4_;
            fVar37 = fVar37 + auVar25._8_4_;
            fVar20 = fVar20 + auVar25._12_4_;
            fVar34 = fVar34 + auVar25._0_4_;
            fVar31 = fVar31 + auVar25._4_4_;
            fVar32 = fVar32 + auVar25._8_4_;
            fVar15 = fVar15 + auVar25._12_4_;
          }
        }
        auVar6._4_4_ = fVar39;
        auVar6._0_4_ = fVar38;
        auVar6._8_4_ = fVar40;
        auVar6._12_4_ = fVar41;
        aVar16.m128 = (__m128)minps(this->bounds0[0].bounds0.lower.field_0,auVar6);
        auVar4._4_4_ = fVar36;
        auVar4._0_4_ = fVar35;
        auVar4._8_4_ = fVar37;
        auVar4._12_4_ = fVar20;
        aVar23.m128 = (__m128)maxps(this->bounds0[0].bounds0.upper.field_0,auVar4);
        auVar8._4_4_ = fVar43;
        auVar8._0_4_ = fVar42;
        auVar8._8_4_ = fVar44;
        auVar8._12_4_ = fVar45;
        aVar28.m128 = (__m128)minps(this->bounds0[0].bounds1.lower.field_0,auVar8);
        auVar2._4_4_ = fVar31;
        auVar2._0_4_ = fVar34;
        auVar2._8_4_ = fVar32;
        auVar2._12_4_ = fVar15;
        aVar29.m128 = (__m128)maxps(this->bounds0[0].bounds1.upper.field_0,auVar2);
        this->bounds0[0].bounds0.lower.field_0 = aVar16;
        this->bounds0[0].bounds0.upper.field_0 = aVar23;
        this->bounds0[0].bounds1.lower.field_0 = aVar28;
        this->bounds0[0].bounds1.upper.field_0 = aVar29;
        fVar30 = (float)(uint)(pPVar1->lbounds).bounds1.upper.field_0.m128[3];
        fVar26 = (pPVar1->time_range).lower;
        fVar21 = (pPVar1->time_range).upper - fVar26;
        fVar20 = floorf(((fVar14 - fVar26) / fVar21) * 1.0000002 * fVar30);
        fVar15 = 0.0;
        if (0.0 <= fVar20) {
          fVar15 = fVar20;
        }
        fVar20 = ceilf(((fVar33 - fVar26) / fVar21) * 0.99999976 * fVar30);
        if (fVar30 <= fVar20) {
          fVar20 = fVar30;
        }
        this->count0[0] = this->count0[0] + (long)((int)fVar20 - (int)fVar15);
        fVar15 = (pPVar1->time_range).upper;
        fVar20 = fVar15 * 0.9999;
      }
      if ((fVar33 < fVar20) && (fVar20 = (pPVar1->time_range).lower, fVar20 * 1.0001 < fVar19)) {
        fVar30 = (float)(uint)(pPVar1->lbounds).bounds1.upper.field_0.m128[3];
        fVar34 = (fVar33 - fVar20) / (fVar15 - fVar20);
        fVar26 = (fVar19 - fVar20) / (fVar15 - fVar20);
        fVar21 = fVar26 * fVar30;
        local_c8.this = recalculatePrimRef;
        local_c8.prim = pPVar1;
        fVar15 = floorf(fVar34 * fVar30);
        fVar20 = ceilf(fVar21);
        iVar12 = (int)fVar15;
        if (fVar15 <= 0.0) {
          fVar15 = 0.0;
        }
        fVar22 = fVar20;
        if (fVar30 <= fVar20) {
          fVar22 = fVar30;
        }
        iVar11 = -1;
        if (-1 < iVar12) {
          iVar11 = iVar12;
        }
        iVar10 = (int)fVar30 + 1;
        if ((int)fVar20 < (int)fVar30 + 1) {
          iVar10 = (int)fVar20;
        }
        SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                  (&blower0,&local_c8,(long)(int)fVar15);
        SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                  (&bupper1,&local_c8,(long)(int)fVar22);
        fVar20 = fVar34 * fVar30 - fVar15;
        if (iVar10 - iVar11 == 1) {
          if (fVar20 <= 0.0) {
            fVar20 = 0.0;
          }
          fVar15 = 1.0 - fVar20;
          fVar38 = fVar15 * blower0.lower.field_0.m128[0] + fVar20 * bupper1.lower.field_0.m128[0];
          fVar39 = fVar15 * blower0.lower.field_0.m128[1] + fVar20 * bupper1.lower.field_0.m128[1];
          fVar40 = fVar15 * blower0.lower.field_0.m128[2] + fVar20 * bupper1.lower.field_0.m128[2];
          fVar41 = fVar15 * blower0.lower.field_0.m128[3] + fVar20 * bupper1.lower.field_0.m128[3];
          fVar35 = fVar15 * blower0.upper.field_0.m128[0] + fVar20 * bupper1.upper.field_0.m128[0];
          fVar36 = fVar15 * blower0.upper.field_0.m128[1] + fVar20 * bupper1.upper.field_0.m128[1];
          fVar37 = fVar15 * blower0.upper.field_0.m128[2] + fVar20 * bupper1.upper.field_0.m128[2];
          fVar20 = fVar15 * blower0.upper.field_0.m128[3] + fVar20 * bupper1.upper.field_0.m128[3];
          fVar22 = fVar22 - fVar21;
          if (fVar22 <= 0.0) {
            fVar22 = 0.0;
          }
          fVar15 = 1.0 - fVar22;
          fVar42 = bupper1.lower.field_0.m128[0] * fVar15 + blower0.lower.field_0.m128[0] * fVar22;
          fVar43 = bupper1.lower.field_0.m128[1] * fVar15 + blower0.lower.field_0.m128[1] * fVar22;
          fVar44 = bupper1.lower.field_0.m128[2] * fVar15 + blower0.lower.field_0.m128[2] * fVar22;
          fVar45 = bupper1.lower.field_0.m128[3] * fVar15 + blower0.lower.field_0.m128[3] * fVar22;
          fVar21 = fVar15 * bupper1.upper.field_0.m128[0] + fVar22 * blower0.upper.field_0.m128[0];
          fVar31 = fVar15 * bupper1.upper.field_0.m128[1] + fVar22 * blower0.upper.field_0.m128[1];
          fVar32 = fVar15 * bupper1.upper.field_0.m128[2] + fVar22 * blower0.upper.field_0.m128[2];
          fVar15 = fVar15 * bupper1.upper.field_0.m128[3] + fVar22 * blower0.upper.field_0.m128[3];
        }
        else {
          SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                    (&blower1,&local_c8,(long)((int)fVar15 + 1));
          SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                    (&bupper0,&local_c8,(long)((int)fVar22 + -1));
          if (fVar20 <= 0.0) {
            fVar20 = 0.0;
          }
          fVar15 = 1.0 - fVar20;
          fVar38 = blower0.lower.field_0.m128[0] * fVar15 + blower1.lower.field_0.m128[0] * fVar20;
          fVar39 = blower0.lower.field_0.m128[1] * fVar15 + blower1.lower.field_0.m128[1] * fVar20;
          fVar40 = blower0.lower.field_0.m128[2] * fVar15 + blower1.lower.field_0.m128[2] * fVar20;
          fVar41 = blower0.lower.field_0.m128[3] * fVar15 + blower1.lower.field_0.m128[3] * fVar20;
          fVar35 = fVar15 * blower0.upper.field_0.m128[0] + fVar20 * blower1.upper.field_0.m128[0];
          fVar36 = fVar15 * blower0.upper.field_0.m128[1] + fVar20 * blower1.upper.field_0.m128[1];
          fVar37 = fVar15 * blower0.upper.field_0.m128[2] + fVar20 * blower1.upper.field_0.m128[2];
          fVar20 = fVar15 * blower0.upper.field_0.m128[3] + fVar20 * blower1.upper.field_0.m128[3];
          fVar15 = fVar22 - fVar21;
          if (fVar22 - fVar21 <= 0.0) {
            fVar15 = 0.0;
          }
          fVar22 = 1.0 - fVar15;
          fVar42 = bupper1.lower.field_0.m128[0] * fVar22 + bupper0.lower.field_0.m128[0] * fVar15;
          fVar43 = bupper1.lower.field_0.m128[1] * fVar22 + bupper0.lower.field_0.m128[1] * fVar15;
          fVar44 = bupper1.lower.field_0.m128[2] * fVar22 + bupper0.lower.field_0.m128[2] * fVar15;
          fVar45 = bupper1.lower.field_0.m128[3] * fVar22 + bupper0.lower.field_0.m128[3] * fVar15;
          fVar21 = fVar22 * bupper1.upper.field_0.m128[0] + fVar15 * bupper0.upper.field_0.m128[0];
          fVar31 = fVar22 * bupper1.upper.field_0.m128[1] + fVar15 * bupper0.upper.field_0.m128[1];
          fVar32 = fVar22 * bupper1.upper.field_0.m128[2] + fVar15 * bupper0.upper.field_0.m128[2];
          fVar15 = fVar22 * bupper1.upper.field_0.m128[3] + fVar15 * bupper0.upper.field_0.m128[3];
          if (iVar12 < 0) {
            iVar12 = -1;
          }
          sVar13 = (size_t)iVar12;
          while (sVar13 = sVar13 + 1, (long)sVar13 < (long)iVar10) {
            fVar22 = ((float)(int)sVar13 / fVar30 - fVar34) / (fVar26 - fVar34);
            fVar27 = 1.0 - fVar22;
            local_a8 = fVar38 * fVar27 + fVar42 * fVar22;
            fStack_a4 = fVar39 * fVar27 + fVar43 * fVar22;
            fStack_a0 = fVar40 * fVar27 + fVar44 * fVar22;
            fStack_9c = fVar41 * fVar27 + fVar45 * fVar22;
            local_b8 = fVar27 * fVar35 + fVar22 * fVar21;
            fStack_b4 = fVar27 * fVar36 + fVar22 * fVar31;
            fStack_b0 = fVar27 * fVar37 + fVar22 * fVar32;
            fStack_ac = fVar27 * fVar20 + fVar22 * fVar15;
            SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                      (&bi,&local_c8,sVar13);
            auVar17._0_4_ = bi.lower.field_0.m128[0] - local_a8;
            auVar17._4_4_ = bi.lower.field_0.m128[1] - fStack_a4;
            auVar17._8_4_ = bi.lower.field_0.m128[2] - fStack_a0;
            auVar17._12_4_ = bi.lower.field_0.m128[3] - fStack_9c;
            auVar24._0_4_ = bi.upper.field_0.m128[0] - local_b8;
            auVar24._4_4_ = bi.upper.field_0.m128[1] - fStack_b4;
            auVar24._8_4_ = bi.upper.field_0.m128[2] - fStack_b0;
            auVar24._12_4_ = bi.upper.field_0.m128[3] - fStack_ac;
            auVar18 = minps(auVar17,ZEXT816(0));
            auVar25 = maxps(auVar24,ZEXT816(0));
            fVar38 = fVar38 + auVar18._0_4_;
            fVar39 = fVar39 + auVar18._4_4_;
            fVar40 = fVar40 + auVar18._8_4_;
            fVar41 = fVar41 + auVar18._12_4_;
            fVar42 = fVar42 + auVar18._0_4_;
            fVar43 = fVar43 + auVar18._4_4_;
            fVar44 = fVar44 + auVar18._8_4_;
            fVar45 = fVar45 + auVar18._12_4_;
            fVar35 = fVar35 + auVar25._0_4_;
            fVar36 = fVar36 + auVar25._4_4_;
            fVar37 = fVar37 + auVar25._8_4_;
            fVar20 = fVar20 + auVar25._12_4_;
            fVar21 = fVar21 + auVar25._0_4_;
            fVar31 = fVar31 + auVar25._4_4_;
            fVar32 = fVar32 + auVar25._8_4_;
            fVar15 = fVar15 + auVar25._12_4_;
          }
        }
        auVar7._4_4_ = fVar39;
        auVar7._0_4_ = fVar38;
        auVar7._8_4_ = fVar40;
        auVar7._12_4_ = fVar41;
        aVar16.m128 = (__m128)minps(this->bounds1[0].bounds0.lower.field_0,auVar7);
        auVar5._4_4_ = fVar36;
        auVar5._0_4_ = fVar35;
        auVar5._8_4_ = fVar37;
        auVar5._12_4_ = fVar20;
        aVar23.m128 = (__m128)maxps(this->bounds1[0].bounds0.upper.field_0,auVar5);
        auVar9._4_4_ = fVar43;
        auVar9._0_4_ = fVar42;
        auVar9._8_4_ = fVar44;
        auVar9._12_4_ = fVar45;
        aVar28.m128 = (__m128)minps(this->bounds1[0].bounds1.lower.field_0,auVar9);
        auVar3._4_4_ = fVar31;
        auVar3._0_4_ = fVar21;
        auVar3._8_4_ = fVar32;
        auVar3._12_4_ = fVar15;
        aVar29.m128 = (__m128)maxps(this->bounds1[0].bounds1.upper.field_0,auVar3);
        this->bounds1[0].bounds0.lower.field_0 = aVar16;
        this->bounds1[0].bounds0.upper.field_0 = aVar23;
        this->bounds1[0].bounds1.lower.field_0 = aVar28;
        this->bounds1[0].bounds1.upper.field_0 = aVar29;
        fVar30 = (float)(uint)(pPVar1->lbounds).bounds1.upper.field_0.m128[3];
        fVar26 = (pPVar1->time_range).lower;
        fVar21 = (pPVar1->time_range).upper - fVar26;
        fVar20 = floorf(((fVar33 - fVar26) / fVar21) * 1.0000002 * fVar30);
        fVar15 = 0.0;
        if (0.0 <= fVar20) {
          fVar15 = fVar20;
        }
        fVar20 = ceilf(((fVar19 - fVar26) / fVar21) * 0.99999976 * fVar30);
        if (fVar30 <= fVar20) {
          fVar20 = fVar30;
        }
        this->count1[0] = this->count1[0] + (long)((int)fVar20 - (int)fVar15);
      }
    }
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }